

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  UnitTestImpl *this_00;
  DeathTestImpl *in_RDI;
  int gtest_retval_1;
  int gtest_retval;
  pid_t child_pid;
  int pipe_fd [2];
  size_t thread_count;
  GTestLog *in_stack_fffffffffffffb30;
  allocator *__rhs;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  undefined1 uVar5;
  string *in_stack_fffffffffffffb40;
  string *message;
  int *in_stack_fffffffffffffb58;
  allocator *streamable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  string local_478 [20];
  int in_stack_fffffffffffffb9c;
  char *in_stack_fffffffffffffba0;
  GTestLogSeverity in_stack_fffffffffffffbac;
  GTestLog *in_stack_fffffffffffffbb0;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  int local_370;
  undefined4 local_36c;
  string local_368 [39];
  undefined1 local_341 [33];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  int local_260;
  undefined4 local_25c;
  string local_258 [39];
  allocator local_231;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  int local_170;
  allocator local_169;
  string local_168 [36];
  undefined4 local_144;
  string local_140 [39];
  undefined1 local_119 [33];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  int local_58;
  int local_54;
  string local_50 [52];
  size_t local_18;
  undefined4 local_4;
  
  local_18 = GetThreadCount();
  if (local_18 != 1) {
    in_stack_fffffffffffffb68 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffe4;
    GTestLog::GTestLog(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba0
                       ,in_stack_fffffffffffffb9c);
    poVar3 = GTestLog::GetStream((GTestLog *)in_stack_fffffffffffffb68);
    DeathTestThreadWarning_abi_cxx11_((size_t)in_RDI);
    std::operator<<(poVar3,local_50);
    std::__cxx11::string::~string(local_50);
    GTestLog::~GTestLog(in_stack_fffffffffffffb30);
  }
  do {
    iVar2 = pipe(&local_58);
    bVar1 = IsTrue(iVar2 != -1);
    if (!bVar1) {
      in_stack_fffffffffffffb60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_119;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_119 + 1),"CHECK failed: File ",
                 (allocator *)in_stack_fffffffffffffb60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      local_144 = 0x1c9b;
      StreamableToString<int>(in_stack_fffffffffffffb58);
      std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      DeathTestAbort(in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string((string *)(local_119 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_119);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  streamable = &local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"",streamable);
  DeathTest::set_last_death_test_message((string *)0x11ebb6);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  CaptureStderr();
  FlushInfoLog();
  local_170 = fork();
  do {
    bVar1 = IsTrue(local_170 != -1);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"CHECK failed: File ",&local_231);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      local_25c = 0x1ca9;
      StreamableToString<int>((int *)streamable);
      std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                     (char *)in_stack_fffffffffffffb30);
      DeathTestAbort(in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  ForkingDeathTest::set_child_pid((ForkingDeathTest *)in_RDI,local_170);
  if (local_170 == 0) {
    do {
      do {
        local_260 = close(local_58);
        bVar1 = false;
        if (local_260 == -1) {
          piVar4 = __errno_location();
          bVar1 = *piVar4 == 4;
        }
      } while (bVar1);
      if (local_260 == -1) {
        message = (string *)local_341;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_341 + 1),"CHECK failed: File ",(allocator *)message);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        local_36c = 0x1cac;
        StreamableToString<int>((int *)streamable);
        std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                       (char *)in_stack_fffffffffffffb30);
        DeathTestAbort(message);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::string::~string(local_2a0);
        std::__cxx11::string::~string(local_2c0);
        std::__cxx11::string::~string(local_2e0);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::~string(local_300);
        std::__cxx11::string::~string(local_320);
        std::__cxx11::string::~string((string *)(local_341 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_341);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_write_fd(in_RDI,local_54);
    LogToStderr();
    this_00 = GetUnitTestImpl();
    UnitTestImpl::listeners(this_00);
    TestEventListeners::SuppressEventForwarding((TestEventListeners *)0x11f266);
    g_in_fast_death_test_child = 1;
    local_4 = EXECUTE_TEST;
  }
  else {
    do {
      do {
        local_370 = close(local_54);
        uVar5 = false;
        if (local_370 == -1) {
          piVar4 = __errno_location();
          uVar5 = *piVar4 == 4;
        }
      } while ((bool)uVar5 != false);
      if (local_370 == -1) {
        __rhs = (allocator *)&stack0xfffffffffffffbaf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffffbb0,"CHECK failed: File ",__rhs)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffffb38),(char *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffffb38),(char *)__rhs);
        StreamableToString<int>((int *)streamable);
        std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffffb38),(char *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffffb38),(char *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffffb38),(char *)__rhs);
        DeathTestAbort(in_stack_fffffffffffffb40);
        std::__cxx11::string::~string(local_390);
        std::__cxx11::string::~string(local_3b0);
        std::__cxx11::string::~string(local_3d0);
        std::__cxx11::string::~string(local_3f0);
        std::__cxx11::string::~string(local_478);
        std::__cxx11::string::~string(local_410);
        std::__cxx11::string::~string(local_430);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbaf);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_read_fd(in_RDI,local_58);
    DeathTestImpl::set_spawned(in_RDI,true);
    local_4 = OVERSEE_TEST;
  }
  return local_4;
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}